

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

big_integer *
anon_unknown.dwarf_a832::extract_random_element<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  size_t v_00;
  int iVar1;
  size_type sVar2;
  reference other;
  __normal_iterator<big_integer_*,_std::vector<big_integer,_std::allocator<big_integer>_>_> local_38
  ;
  big_integer *local_30;
  undefined1 local_21;
  ulong local_20;
  size_t index;
  vector<big_integer,_std::allocator<big_integer>_> *v_local;
  big_integer *copy;
  
  index = (size_t)v;
  v_local = (vector<big_integer,_std::allocator<big_integer>_> *)__return_storage_ptr__;
  iVar1 = rand();
  sVar2 = std::vector<big_integer,_std::allocator<big_integer>_>::size
                    ((vector<big_integer,_std::allocator<big_integer>_> *)index);
  local_20 = (ulong)(long)iVar1 % sVar2;
  local_21 = 0;
  other = std::vector<big_integer,_std::allocator<big_integer>_>::operator[]
                    ((vector<big_integer,_std::allocator<big_integer>_> *)index,local_20);
  big_integer::big_integer(__return_storage_ptr__,other);
  v_00 = index;
  local_38._M_current =
       (big_integer *)
       std::vector<big_integer,_std::allocator<big_integer>_>::begin
                 ((vector<big_integer,_std::allocator<big_integer>_> *)index);
  local_30 = (big_integer *)
             __gnu_cxx::
             __normal_iterator<big_integer_*,_std::vector<big_integer,_std::allocator<big_integer>_>_>
             ::operator+(&local_38,local_20);
  erase_unordered<big_integer>
            ((vector<big_integer,_std::allocator<big_integer>_> *)v_00,(iterator)local_30);
  return __return_storage_ptr__;
}

Assistant:

T extract_random_element(std::vector<T> &v) {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }